

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int pigpio_command_ext(int pi,int command,int p1,int p2,int p3,int extents,gpioExtent_t *ext,int rl)

{
  ssize_t sVar1;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  cmdCmd_t cmd;
  int i;
  undefined1 local_30 [12];
  int local_24;
  int local_20;
  int local_1c;
  int local_8;
  int local_4;
  
  if (((in_EDI < 0) || (0x1f < in_EDI)) || (gPiInUse[in_EDI] == 0)) {
    local_4 = -0x7db;
  }
  else {
    local_24 = in_R8D;
    local_1c = in_R9D;
    local_8 = in_EDI;
    _pml(0);
    sVar1 = send(gPigCommand[local_8],local_30,0x10,0);
    if (sVar1 == 0x10) {
      for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
        sVar1 = send(gPigCommand[local_8],*(void **)(cmd._0_8_ + (long)local_20 * 0x18 + 8),
                     *(size_t *)(cmd._0_8_ + (long)local_20 * 0x18),0);
        if (sVar1 != *(long *)(cmd._0_8_ + (long)local_20 * 0x18)) {
          _pmu(0);
          return -2000;
        }
      }
      sVar1 = recv(gPigCommand[local_8],local_30,0x10,0x100);
      if (sVar1 == 0x10) {
        if (cmd.p2 != 0) {
          _pmu(0);
        }
        local_4 = local_24;
      }
      else {
        _pmu(0);
        local_4 = -0x7d1;
      }
    }
    else {
      _pmu(0);
      local_4 = -2000;
    }
  }
  return local_4;
}

Assistant:

static int pigpio_command_ext
   (int pi, int command, int p1, int p2, int p3,
    int extents, gpioExtent_t *ext, int rl)
{
   int i;
   cmdCmd_t cmd;

   if ((pi < 0) || (pi >= MAX_PI) || !gPiInUse[pi])
      return pigif_unconnected_pi;

   cmd.cmd = command;
   cmd.p1  = p1;
   cmd.p2  = p2;
   cmd.p3  = p3;

   _pml(pi);

   if (send(gPigCommand[pi], &cmd, sizeof(cmd), 0) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_send;
   }

   for (i=0; i<extents; i++)
   {
      if (send(gPigCommand[pi], ext[i].ptr, ext[i].size, 0) != ext[i].size)
      {
         _pmu(pi);
         return pigif_bad_send;
      }
   }

   if (recv(gPigCommand[pi], &cmd, sizeof(cmd), MSG_WAITALL) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_recv;
   }
   if (rl) _pmu(pi);

   return cmd.res;
}